

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CupdlpWrapper.cpp
# Opt level: O0

int formulateLP_highs(HighsLp *lp,double **cost,int *nCols,int *nRows,int *nnz,int *nEqs,
                     int **csc_beg,int **csc_idx,double **csc_val,double **rhs,double **lower,
                     double **upper,double *offset,double *sense_origin,int *nCols_origin,
                     int **constraint_new_idx,int **constraint_type)

{
  double *pdVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  const_reference pvVar7;
  double *pdVar8;
  double *pdVar9;
  int *piVar10;
  int *piVar11;
  double *pdVar12;
  void *pvVar13;
  const_reference pvVar14;
  int *in_RCX;
  int *in_RDX;
  long *in_RSI;
  int *in_RDI;
  int *in_R8;
  int *in_R9;
  int j_5;
  int i_10;
  int j_4;
  int j_3;
  int k;
  int i_9;
  int i_8;
  int i_7;
  int j_2;
  int i_6;
  int j_1;
  int i_5;
  int i_4;
  int j;
  int i_3;
  int i_2;
  int i_1;
  int i;
  int has_upper;
  int has_lower;
  double *A_csc_val;
  HighsInt *A_csc_idx;
  HighsInt *A_csc_beg;
  double *rhs_clp;
  double *lhs_clp;
  int nnz_clp;
  int nRows_clp;
  int nCols_clp;
  int retcode;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  int local_80;
  int local_7c;
  int local_78;
  uint local_74;
  
  local_b8 = *in_RDI;
  iVar2 = in_RDI[1];
  pvVar7 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x24),(long)*in_RDI);
  iVar3 = *pvVar7;
  *_has_upper = local_b8;
  *in_RCX = iVar2;
  *in_RDX = local_b8;
  *in_R9 = 0;
  *in_R8 = iVar3;
  *_i_3 = *(undefined8 *)(in_RDI + 0x3e);
  if (in_RDI[0x3c] == 1) {
    *_i_1 = 1.0;
  }
  else if (in_RDI[0x3c] == -1) {
    *_i_1 = -1.0;
  }
  pdVar8 = std::vector<double,_std::allocator<double>_>::data
                     ((vector<double,_std::allocator<double>_> *)0x6baa5a);
  pdVar9 = std::vector<double,_std::allocator<double>_>::data
                     ((vector<double,_std::allocator<double>_> *)0x6baa70);
  piVar10 = std::vector<int,_std::allocator<int>_>::data
                      ((vector<int,_std::allocator<int>_> *)0x6baa8d);
  piVar11 = std::vector<int,_std::allocator<int>_>::data
                      ((vector<int,_std::allocator<int>_> *)0x6baaaa);
  pdVar12 = std::vector<double,_std::allocator<double>_>::data
                      ((vector<double,_std::allocator<double>_> *)0x6baac7);
  pvVar13 = malloc((long)*in_RCX << 2);
  *(void **)A_csc_idx = pvVar13;
  pvVar13 = malloc((long)*in_RCX << 2);
  *A_csc_val = (double)pvVar13;
  for (local_74 = 0; (int)local_74 < iVar2; local_74 = local_74 + 1) {
    bVar6 = -1e+20 < pdVar8[(int)local_74];
    bVar4 = pdVar9[(int)local_74] != 1e+20;
    bVar5 = pdVar9[(int)local_74] <= 1e+20;
    if ((((!bVar6) || (!bVar5 || !bVar4)) || (pdVar8[(int)local_74] != pdVar9[(int)local_74])) ||
       (NAN(pdVar8[(int)local_74]) || NAN(pdVar9[(int)local_74]))) {
      if ((!bVar6) || (bVar5 && bVar4)) {
        if ((bVar6) || (!bVar5 || !bVar4)) {
          if ((bVar6) && (bVar5 && bVar4)) {
            *(undefined4 *)(*(long *)A_csc_idx + (long)(int)local_74 * 4) = 3;
            *in_RDX = *in_RDX + 1;
            *in_R8 = *in_R8 + 1;
            *in_R9 = *in_R9 + 1;
          }
          else {
            printf("Warning: constraint %d has no lower and upper bound\n",(ulong)local_74);
            *(undefined4 *)(*(long *)A_csc_idx + (long)(int)local_74 * 4) = 3;
            *in_RDX = *in_RDX + 1;
            *in_R8 = *in_R8 + 1;
            *in_R9 = *in_R9 + 1;
          }
        }
        else {
          *(undefined4 *)(*(long *)A_csc_idx + (long)(int)local_74 * 4) = 1;
        }
      }
      else {
        *(undefined4 *)(*(long *)A_csc_idx + (long)(int)local_74 * 4) = 2;
      }
    }
    else {
      *(undefined4 *)(*(long *)A_csc_idx + (long)(int)local_74 * 4) = 0;
      *in_R9 = *in_R9 + 1;
    }
  }
  pvVar13 = malloc((long)*in_RDX << 3);
  *in_RSI = (long)pvVar13;
  pvVar13 = malloc((long)*in_RDX << 3);
  *_j_1 = (long)pvVar13;
  pvVar13 = malloc((long)*in_RDX << 3);
  *_i_4 = (long)pvVar13;
  pvVar13 = malloc((long)(*in_RDX + 1) << 2);
  *_j_4 = (long)pvVar13;
  pvVar13 = malloc((long)*in_R8 << 2);
  *_k = (long)pvVar13;
  pvVar13 = malloc((long)*in_R8 << 3);
  *_i_8 = (long)pvVar13;
  pvVar13 = malloc((long)*in_RCX << 3);
  *_j_2 = (long)pvVar13;
  for (local_78 = 0; local_7c = local_b8, local_78 < local_b8; local_78 = local_78 + 1) {
    pvVar14 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)(in_RDI + 2),(long)local_78);
    *(double *)(*in_RSI + (long)local_78 * 8) = *pvVar14 * *_i_1;
    pvVar14 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)(in_RDI + 8),(long)local_78);
    *(value_type *)(*_j_1 + (long)local_78 * 8) = *pvVar14;
    pvVar14 = std::vector<double,_std::allocator<double>_>::operator[]
                        ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xe),(long)local_78);
    *(value_type *)(*_i_4 + (long)local_78 * 8) = *pvVar14;
  }
  for (; local_7c < *in_RDX; local_7c = local_7c + 1) {
    *(undefined8 *)(*in_RSI + (long)local_7c * 8) = 0;
  }
  local_84 = local_b8;
  for (local_80 = 0; local_80 < *in_RCX; local_80 = local_80 + 1) {
    if (*(int *)(*(long *)A_csc_idx + (long)local_80 * 4) == 3) {
      *(double *)(*_j_1 + (long)local_84 * 8) = pdVar8[local_80];
      *(double *)(*_i_4 + (long)local_84 * 8) = pdVar9[local_80];
      local_84 = local_84 + 1;
    }
  }
  for (local_88 = 0; local_88 < *in_RDX; local_88 = local_88 + 1) {
    pdVar1 = (double *)(*_j_1 + (long)local_88 * 8);
    if (*pdVar1 <= -1e+20 && *pdVar1 != -1e+20) {
      *(undefined8 *)(*_j_1 + (long)local_88 * 8) = 0xfff0000000000000;
    }
    if (1e+20 < *(double *)(*_i_4 + (long)local_88 * 8)) {
      *(undefined8 *)(*_i_4 + (long)local_88 * 8) = 0x7ff0000000000000;
    }
  }
  local_90 = 0;
  for (local_8c = 0; local_8c < *in_RCX; local_8c = local_8c + 1) {
    if (*(int *)(*(long *)A_csc_idx + (long)local_8c * 4) == 0) {
      *(double *)(*_j_2 + (long)local_90 * 8) = pdVar8[local_8c];
      *(int *)((long)*A_csc_val + (long)local_8c * 4) = local_90;
      local_90 = local_90 + 1;
    }
    else if (*(int *)(*(long *)A_csc_idx + (long)local_8c * 4) == 3) {
      *(undefined8 *)(*_j_2 + (long)local_90 * 8) = 0;
      *(int *)((long)*A_csc_val + (long)local_8c * 4) = local_90;
      local_90 = local_90 + 1;
    }
  }
  local_94 = 0;
  local_98 = *in_R9;
  for (; local_94 < *in_RCX; local_94 = local_94 + 1) {
    if (*(int *)(*(long *)A_csc_idx + (long)local_94 * 4) == 1) {
      *(double *)(*_j_2 + (long)local_98 * 8) = -pdVar9[local_94];
      *(int *)((long)*A_csc_val + (long)local_94 * 4) = local_98;
      local_98 = local_98 + 1;
    }
    else if (*(int *)(*(long *)A_csc_idx + (long)local_94 * 4) == 2) {
      *(double *)(*_j_2 + (long)local_98 * 8) = pdVar8[local_94];
      *(int *)((long)*A_csc_val + (long)local_94 * 4) = local_98;
      local_98 = local_98 + 1;
    }
  }
  for (local_9c = 0; iVar2 = local_b8, local_9c < local_b8 + 1; local_9c = local_9c + 1) {
    *(int *)(*_j_4 + (long)local_9c * 4) = piVar10[local_9c];
  }
  while (local_a0 = iVar2 + 1, local_a0 < *in_RDX + 1) {
    *(int *)(*_j_4 + (long)local_a0 * 4) = *(int *)(*_j_4 + (long)iVar2 * 4) + 1;
    iVar2 = local_a0;
  }
  local_a8 = 0;
  for (local_a4 = 0; local_a4 < local_b8; local_a4 = local_a4 + 1) {
    for (local_ac = *(int *)(*_j_4 + (long)local_a4 * 4);
        local_ac < *(int *)(*_j_4 + (long)(local_a4 + 1) * 4); local_ac = local_ac + 1) {
      if ((*(int *)(*(long *)A_csc_idx + (long)piVar11[local_ac] * 4) == 0) ||
         (*(int *)(*(long *)A_csc_idx + (long)piVar11[local_ac] * 4) == 3)) {
        *(undefined4 *)(*_k + (long)local_a8 * 4) =
             *(undefined4 *)((long)*A_csc_val + (long)piVar11[local_ac] * 4);
        *(double *)(*_i_8 + (long)local_a8 * 8) = pdVar12[local_ac];
        local_a8 = local_a8 + 1;
      }
    }
    for (local_b0 = *(int *)(*_j_4 + (long)local_a4 * 4);
        local_b0 < *(int *)(*_j_4 + (long)(local_a4 + 1) * 4); local_b0 = local_b0 + 1) {
      if (*(int *)(*(long *)A_csc_idx + (long)piVar11[local_b0] * 4) == 1) {
        *(undefined4 *)(*_k + (long)local_a8 * 4) =
             *(undefined4 *)((long)*A_csc_val + (long)piVar11[local_b0] * 4);
        *(double *)(*_i_8 + (long)local_a8 * 8) = -pdVar12[local_b0];
        local_a8 = local_a8 + 1;
      }
      else if (*(int *)(*(long *)A_csc_idx + (long)piVar11[local_b0] * 4) == 2) {
        *(undefined4 *)(*_k + (long)local_a8 * 4) =
             *(undefined4 *)((long)*A_csc_val + (long)piVar11[local_b0] * 4);
        *(double *)(*_i_8 + (long)local_a8 * 8) = pdVar12[local_b0];
        local_a8 = local_a8 + 1;
      }
    }
  }
  for (local_b4 = 0; local_b4 < *in_RCX; local_b4 = local_b4 + 1) {
    if (*(int *)(*(long *)A_csc_idx + (long)local_b4 * 4) == 3) {
      *(undefined4 *)(*_k + (long)*(int *)(*_j_4 + (long)local_b8 * 4) * 4) =
           *(undefined4 *)((long)*A_csc_val + (long)local_b4 * 4);
      *(undefined8 *)(*_i_8 + (long)*(int *)(*_j_4 + (long)local_b8 * 4) * 8) = 0xbff0000000000000;
      local_b8 = local_b8 + 1;
    }
  }
  return 0;
}

Assistant:

int formulateLP_highs(const HighsLp& lp, double** cost, int* nCols, int* nRows,
                      int* nnz, int* nEqs, int** csc_beg, int** csc_idx,
                      double** csc_val, double** rhs, double** lower,
                      double** upper, double* offset, double* sense_origin,
                      int* nCols_origin, int** constraint_new_idx,
                      int** constraint_type) {
  int retcode = 0;

  // problem size for malloc
  int nCols_clp = lp.num_col_;
  int nRows_clp = lp.num_row_;
  int nnz_clp = lp.a_matrix_.start_[lp.num_col_];
  *nCols_origin = nCols_clp;
  *nRows = nRows_clp;    // need not recalculate
  *nCols = nCols_clp;    // need recalculate
  *nEqs = 0;             // need recalculate
  *nnz = nnz_clp;        // need recalculate
  *offset = lp.offset_;  // need not recalculate
  if (lp.sense_ == ObjSense::kMinimize) {
    *sense_origin = 1.0;
  } else if (lp.sense_ == ObjSense::kMaximize) {
    *sense_origin = -1.0;
  }

  const double* lhs_clp = lp.row_lower_.data();
  const double* rhs_clp = lp.row_upper_.data();
  const HighsInt* A_csc_beg = lp.a_matrix_.start_.data();
  const HighsInt* A_csc_idx = lp.a_matrix_.index_.data();
  const double* A_csc_val = lp.a_matrix_.value_.data();
  int has_lower, has_upper;

  cupdlp_init_int(*constraint_type, *nRows);
  cupdlp_init_int(*constraint_new_idx, *nRows);

  // recalculate nRows and nnz for Ax - z = 0
  for (int i = 0; i < nRows_clp; i++) {
    has_lower = lhs_clp[i] > -1e20;
    has_upper = rhs_clp[i] < 1e20;

    // count number of equations and rows
    if (has_lower && has_upper && lhs_clp[i] == rhs_clp[i]) {
      (*constraint_type)[i] = EQ;
      (*nEqs)++;
    } else if (has_lower && !has_upper) {
      (*constraint_type)[i] = GEQ;
    } else if (!has_lower && has_upper) {
      (*constraint_type)[i] = LEQ;
    } else if (has_lower && has_upper) {
      (*constraint_type)[i] = BOUND;
      (*nCols)++;
      (*nnz)++;
      (*nEqs)++;
    } else {
      // printf("Error: constraint %d has no lower and upper bound\n", i);
      // retcode = 1;
      // goto exit_cleanup;

      // what if regard free as bounded
      printf("Warning: constraint %d has no lower and upper bound\n", i);
      (*constraint_type)[i] = BOUND;
      (*nCols)++;
      (*nnz)++;
      (*nEqs)++;
    }
  }

  // allocate memory
  cupdlp_init_double(*cost, *nCols);
  cupdlp_init_double(*lower, *nCols);
  cupdlp_init_double(*upper, *nCols);
  cupdlp_init_int(*csc_beg, *nCols + 1);
  cupdlp_init_int(*csc_idx, *nnz);
  cupdlp_init_double(*csc_val, *nnz);
  cupdlp_init_double(*rhs, *nRows);

  // cost, lower, upper
  for (int i = 0; i < nCols_clp; i++) {
    (*cost)[i] = lp.col_cost_[i] * (*sense_origin);
    (*lower)[i] = lp.col_lower_[i];

    (*upper)[i] = lp.col_upper_[i];
  }
  // slack costs
  for (int i = nCols_clp; i < *nCols; i++) {
    (*cost)[i] = 0.0;
  }
  // slack bounds
  for (int i = 0, j = nCols_clp; i < *nRows; i++) {
    if ((*constraint_type)[i] == BOUND) {
      (*lower)[j] = lhs_clp[i];
      (*upper)[j] = rhs_clp[i];
      j++;
    }
  }

  for (int i = 0; i < *nCols; i++) {
    if ((*lower)[i] < -1e20) (*lower)[i] = -INFINITY;
    if ((*upper)[i] > 1e20) (*upper)[i] = INFINITY;
  }

  // permute LP rhs
  // EQ or BOUND first
  for (int i = 0, j = 0; i < *nRows; i++) {
    if ((*constraint_type)[i] == EQ) {
      (*rhs)[j] = lhs_clp[i];
      (*constraint_new_idx)[i] = j;
      j++;
    } else if ((*constraint_type)[i] == BOUND) {
      (*rhs)[j] = 0.0;
      (*constraint_new_idx)[i] = j;
      j++;
    }
  }
  // then LEQ or GEQ
  for (int i = 0, j = *nEqs; i < *nRows; i++) {
    if ((*constraint_type)[i] == LEQ) {
      (*rhs)[j] = -rhs_clp[i];  // multiply -1
      (*constraint_new_idx)[i] = j;
      j++;
    } else if ((*constraint_type)[i] == GEQ) {
      (*rhs)[j] = lhs_clp[i];
      (*constraint_new_idx)[i] = j;
      j++;
    }
  }

  // formulate and permute LP matrix
  // beg remains the same
  for (int i = 0; i < nCols_clp + 1; i++) (*csc_beg)[i] = A_csc_beg[i];
  for (int i = nCols_clp + 1; i < *nCols + 1; i++)
    (*csc_beg)[i] = (*csc_beg)[i - 1] + 1;

  // row idx changes
  for (int i = 0, k = 0; i < nCols_clp; i++) {
    // same order as in rhs
    // EQ or BOUND first
    for (int j = (*csc_beg)[i]; j < (*csc_beg)[i + 1]; j++) {
      if ((*constraint_type)[A_csc_idx[j]] == EQ ||
          (*constraint_type)[A_csc_idx[j]] == BOUND) {
        (*csc_idx)[k] = (*constraint_new_idx)[A_csc_idx[j]];
        (*csc_val)[k] = A_csc_val[j];
        k++;
      }
    }
    // then LEQ or GEQ
    for (int j = (*csc_beg)[i]; j < (*csc_beg)[i + 1]; j++) {
      if ((*constraint_type)[A_csc_idx[j]] == LEQ) {
        (*csc_idx)[k] = (*constraint_new_idx)[A_csc_idx[j]];
        (*csc_val)[k] = -A_csc_val[j];  // multiply -1
        k++;
      } else if ((*constraint_type)[A_csc_idx[j]] == GEQ) {
        (*csc_idx)[k] = (*constraint_new_idx)[A_csc_idx[j]];
        (*csc_val)[k] = A_csc_val[j];
        k++;
      }
    }
  }

  // slacks for BOUND
  for (int i = 0, j = nCols_clp; i < *nRows; i++) {
    if ((*constraint_type)[i] == BOUND) {
      (*csc_idx)[(*csc_beg)[j]] = (*constraint_new_idx)[i];
      (*csc_val)[(*csc_beg)[j]] = -1.0;
      j++;
    }
  }

  return retcode;
}